

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::StringFormatTask::checkArguments
          (StringFormatTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  Type *this_00;
  bool bVar2;
  Diagnostic *diag;
  long lVar3;
  bool bVar4;
  long lVar5;
  Args local_40;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount
                    ((SystemSubroutine *)this,context,false,args,range,2,0x7fffffff);
  lVar5 = 400;
  if (bVar2) {
    lVar3 = 0;
    bVar2 = true;
    do {
      bVar4 = bVar2;
      this_00 = (args->_M_ptr[lVar3]->type).ptr;
      bVar2 = Type::canBeStringLike(this_00);
      if (!bVar2) {
        diag = ASTContext::addDiag(context,(DiagCode)0x1b000b,args->_M_ptr[lVar3]->sourceRange);
        ast::operator<<(diag,this_00);
        goto LAB_008b74b6;
      }
      lVar3 = 1;
      bVar2 = false;
    } while (bVar4);
    local_40._M_extent._M_extent_value = (args->_M_extent)._M_extent_value - 1;
    local_40._M_ptr = args->_M_ptr + 1;
    bVar2 = FmtHelpers::checkSFormatArgs(context,&local_40);
    lVar5 = (ulong)!bVar2 * 8 + 0x188;
  }
LAB_008b74b6:
  return *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar5);
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 2, INT32_MAX))
            return comp.getErrorType();

        for (size_t i = 0; i < 2; i++) {
            const Type& ft = *args[i]->type;
            if (!ft.canBeStringLike()) {
                context.addDiag(diag::InvalidStringArg, args[i]->sourceRange) << ft;
                return comp.getErrorType();
            }
        }

        if (!FmtHelpers::checkSFormatArgs(context, args.subspan(1)))
            return comp.getErrorType();

        return comp.getVoidType();
    }